

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_>::TPZFrontMatrix
          (TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_> *this,void **vtt)

{
  TPZFileEqnStorage<double> *in_RSI;
  undefined8 *in_RDI;
  void **in_stack_ffffffffffffffb8;
  TPZVec<int> *this_00;
  TPZAbstractFrontMatrix<double> *in_stack_ffffffffffffffc0;
  TPZFrontSym<double> *this_01;
  undefined8 *newsize;
  TPZVec<int> *in_stack_ffffffffffffffe0;
  TPZFileEqnStorage<double> *this_02;
  
  this_02 = in_RSI;
  TPZAbstractFrontMatrix<double>::TPZAbstractFrontMatrix
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *in_RDI = (in_RSI->super_TPZSavable)._vptr_TPZSavable;
  newsize = in_RDI + 4;
  TPZFileEqnStorage<double>::TPZFileEqnStorage(this_02);
  this_01 = (TPZFrontSym<double> *)(in_RDI + 0x1b);
  TPZFrontSym<double>::TPZFrontSym(this_01);
  this_00 = (TPZVec<int> *)(in_RDI + 0x42);
  TPZVec<int>::TPZVec(this_00);
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x46));
  TPZFrontSym<double>::Reset(this_01,(int64_t)this_00);
  TPZFileEqnStorage<double>::Reset((TPZFileEqnStorage<double> *)(in_RDI + 4));
  TPZVec<int>::Resize(in_stack_ffffffffffffffe0,(int64_t)newsize);
  TPZVec<int>::Resize(in_stack_ffffffffffffffe0,(int64_t)newsize);
  in_RDI[0x41] = 0xffffffffffffffff;
  in_RDI[0x40] = 0;
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::TPZFrontMatrix() : TPZRegisterClassId(&TPZFrontMatrix::ClassId),
TPZAbstractFrontMatrix<TVar>()
{
	fFront.Reset();
	fStorage.Reset();
	fNumElConnected.Resize(0);
	fNumElConnectedBackup.Resize(0);
	fLastDecomposed = -1;
	fNumEq=0;
}